

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bezier.h
# Opt level: O0

TightBoundingBox * __thiscall
bezier::Bezier<3UL>::tbb(TightBoundingBox *__return_storage_ptr__,Bezier<3UL> *this)

{
  double *this_00;
  Point *pPVar1;
  double dVar2;
  Vec2 VVar3;
  ExtremePoints local_98;
  Vec2 local_80;
  double local_70;
  double angle;
  Vec2 translation;
  Bezier<3UL> bezier;
  Bezier<3UL> *this_local;
  
  translation.y = (this->mControlPoints)._M_elems[0].x;
  this_00 = &translation.y;
  pPVar1 = operator[]((Bezier<3UL> *)this_00,3);
  VVar3 = Vec2::operator-(pPVar1);
  angle = VVar3.x;
  translation.x = VVar3.y;
  translate((Bezier<3UL> *)this_00,(Vec2 *)&angle);
  pPVar1 = operator[]((Bezier<3UL> *)this_00,0);
  dVar2 = Vec2::angle(pPVar1);
  local_70 = -dVar2;
  Vec2::Vec2(&local_80,0.0,0.0);
  rotate((Bezier<3UL> *)this_00,-dVar2,local_80);
  extremePoints(&local_98,(Bezier<3UL> *)this_00);
  TightBoundingBox::TightBoundingBox(__return_storage_ptr__,&local_98,(Vec2 *)&angle,local_70);
  ExtremePoints::~ExtremePoints(&local_98);
  return __return_storage_ptr__;
}

Assistant:

TightBoundingBox tbb() const
        {
            Bezier<N> bezier = *this;

            // Translate last control point (highest order) to origo.
            Vec2 translation(-bezier[N]);
            bezier.translate(translation);

            // Rotate bezier to align the first control point (lowest order) with the x-axis
            double angle = -bezier[0].angle();
            bezier.rotate(angle);

            return TightBoundingBox(bezier.extremePoints(), translation, angle);
        }